

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateTime.h
# Opt level: O2

DateTime DateTime::Now(bool useMicroseconds)

{
  long lVar1;
  undefined3 in_register_00000039;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  if (CONCAT31(in_register_00000039,useMicroseconds) == 0) {
    lVar1 = (lVar1 / 1000000000) * 1000000;
  }
  else {
    lVar1 = lVar1 / 1000;
  }
  return (DateTime)(lVar1 + 0xdcbffeff2bc000);
}

Assistant:

static DateTime Now(bool useMicroseconds = false)
    {
        using namespace std::chrono;
        if (useMicroseconds)
        {
            return DateTime(UnixEpoch +
                    duration_cast<microseconds>(system_clock::now()
                    .time_since_epoch()).count() * TicksPerMicrosecond);
        }
        else
        {
            return DateTime(UnixEpoch +
                duration_cast<seconds>(system_clock::now()
                    .time_since_epoch()).count() * TicksPerSecond);
        }
    }